

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O2

AssignBlock128
tcu::astc::anon_unknown_0::generateNormalBlock
          (NormalBlockParams *blockParams,int blockWidth,int blockHeight,
          NormalBlockISEInputs *iseInputs)

{
  ISEParams *pIVar1;
  deUint32 *pdVar2;
  int iVar3;
  int iVar4;
  ISEInput *pIVar5;
  int iVar6;
  deUint32 dVar7;
  ulong uVar8;
  uint *puVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  byte bVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  undefined4 in_register_00000034;
  uint uVar19;
  long lVar20;
  uint uVar21;
  int *piVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  int iVar26;
  AssignBlock128 AVar27;
  deUint32 *local_a0;
  AssignBlock128 local_88;
  BitAssignAccessStream local_78;
  ISEParams *local_60;
  ISEInput *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ISEParams local_38;
  
  local_58 = (ISEInput *)CONCAT44(in_register_00000034,blockWidth);
  local_88.m_words[0] = 0;
  local_88.m_words[1] = 0;
  iVar3 = blockParams->weightGridWidth;
  iVar26 = blockParams->weightGridHeight;
  bVar13 = blockParams->isDualPlane;
  iVar16 = iVar26 * iVar3 << (bVar13 & 0x1f);
  pIVar1 = &blockParams->weightISEParams;
  iVar6 = computeNumRequiredBits(pIVar1,iVar16);
  local_60 = pIVar1;
  dVar7 = computeISERangeMax(pIVar1);
  uVar10 = 0xffffffff;
  uVar11 = 2;
  switch(dVar7) {
  case 1:
    uVar8 = 0;
    break;
  case 2:
    uVar8 = 0;
    goto LAB_0093fad7;
  case 3:
    uVar8 = 0;
    goto LAB_0093faeb;
  case 4:
    uVar8 = 0;
    goto LAB_0093fae1;
  case 5:
    uVar8 = 0;
    goto LAB_0093fad1;
  case 6:
  case 8:
  case 10:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x14:
  case 0x15:
  case 0x16:
    goto switchD_0093fa8b_caseD_6;
  case 7:
    uVar8 = 0;
LAB_0093fab5:
    uVar11 = 7;
    break;
  case 9:
    uVar8 = 0x200;
    break;
  case 0xb:
    uVar8 = 0x200;
LAB_0093fad7:
    uVar11 = 3;
    break;
  case 0xf:
    uVar8 = 0x200;
LAB_0093faeb:
    uVar11 = 4;
    break;
  case 0x13:
    uVar8 = 0x200;
LAB_0093fae1:
    uVar11 = 5;
    break;
  case 0x17:
    uVar8 = 0x200;
LAB_0093fad1:
    uVar11 = 6;
    break;
  default:
    if (dVar7 == 0x1f) {
      uVar8 = 0x200;
      goto LAB_0093fab5;
    }
    goto switchD_0093fa8b_caseD_6;
  }
LAB_0093faee:
  piVar22 = &DAT_00a2ff34;
  uVar24 = 10;
  for (lVar20 = 0; uVar17 = uVar10, lVar20 != 10; lVar20 = lVar20 + 1) {
    local_78.m_dst =
         (AssignBlock128 *)((ulong)(uint)~(-1 << (*(byte *)(piVar22 + -5) & 0x1f)) << 0x20);
    local_78.m_startNdxInSrc = ~(-1 << (*(byte *)(piVar22 + -4) & 0x1f));
    iVar12 = piVar22[-2];
    if ((iVar12 <= iVar3) &&
       (uVar17 = piVar22[-3], iVar3 <= iVar12 + *(int *)((long)&local_78.m_dst + (ulong)uVar17 * 4))
       ) {
      iVar4 = *piVar22;
      if ((iVar4 <= iVar26) &&
         (uVar14 = piVar22[-1],
         iVar26 <= iVar4 + *(int *)((long)&local_78.m_dst + (ulong)uVar14 * 4))) {
        if (uVar17 == 1) {
          uVar17 = 0xffffffff;
          uVar24 = iVar3 - iVar12;
        }
        else if (uVar17 == 2) {
          uVar24 = 0xffffffff;
          uVar17 = iVar3 - iVar12;
        }
        else {
          uVar17 = 0xffffffff;
          uVar24 = uVar17;
        }
        uVar10 = iVar26 - iVar4;
        if ((uVar14 != 1) && (uVar10 = uVar24, uVar14 == 2)) {
          uVar17 = iVar26 - iVar4;
        }
        uVar24 = (uint)lVar20;
        break;
      }
    }
    piVar22 = piVar22 + 6;
  }
  if (9 < uVar24) {
    uVar8 = 0;
    goto LAB_0093fdc3;
  }
  uVar23 = uVar10 & 1;
  uVar10 = uVar10 >> 1 & 1;
  uVar25 = uVar17 & 1;
  uVar14 = uVar17 >> 1 & 1;
  uVar21 = uVar11 & 1;
  uVar19 = uVar11 >> 1 & 1;
  uVar11 = uVar11 >> 2 & 1;
  switch(uVar24) {
  case 0:
    uVar10 = uVar19 + uVar11 * 2 |
             uVar21 << 4 |
             uVar23 << 5 | uVar10 << 6 | uVar25 << 7 | uVar14 << 8 | (uint)bVar13 << 10;
    goto LAB_0093fd59;
  case 1:
    uVar8 = (uVar19 + uVar11 * 2 |
            uVar21 << 4 | uVar23 << 5 | uVar10 << 6 | uVar25 << 7 | uVar14 << 8 | (uint)bVar13 << 10
            ) | uVar8 | 4;
    break;
  case 2:
    uVar8 = (uVar19 + uVar11 * 2 |
            uVar21 << 4 | uVar23 << 5 | uVar10 << 6 | uVar25 << 7 | uVar14 << 8 | (uint)bVar13 << 10
            ) | uVar8 | 8;
    break;
  case 3:
    uVar8 = (ulong)(uVar10 << 6) | (ulong)bVar13 << 10 | uVar8 |
            (ulong)(uVar21 * 0x10 + uVar11 * 2 | uVar19) | (ulong)uVar17 << 7 | (ulong)(uVar23 << 5)
            | 0xc;
    break;
  case 4:
    uVar8 = (ulong)(uVar10 << 6) | (ulong)bVar13 << 10 | uVar8 |
            (ulong)(uVar21 * 0x10 + uVar11 * 2 | uVar23 << 5 | uVar19) | (ulong)uVar17 << 7 | 0x10c;
    break;
  case 5:
    uVar10 = (uVar21 << 4 | uVar23 << 5 | uVar10 << 6 | (uint)bVar13 << 10) + uVar11 * 8 +
             uVar19 * 4;
LAB_0093fd59:
    uVar8 = uVar10 | uVar8;
    break;
  case 6:
    uVar8 = uVar8 | (uVar21 << 4 | uVar23 << 5 | uVar10 << 6 | (uint)bVar13 << 10) + uVar11 * 8 +
                    uVar19 * 4 | 0x80;
    break;
  case 7:
    uVar8 = uVar8 | (uVar21 << 4 | (uint)bVar13 << 10) + uVar11 * 8 + uVar19 * 4 | 0x180;
    break;
  case 8:
    uVar8 = uVar8 | (uVar21 << 4 | (uint)bVar13 << 10) + uVar11 * 8 + uVar19 * 4 | 0x1a0;
    break;
  case 9:
    uVar8 = (ulong)(uVar21 * 0x10 + uVar11 * 8 + uVar19 * 4 | uVar23 << 5 | uVar25 << 9 |
                    uVar10 << 6 | uVar14 << 10 | 0x100);
  }
  uVar8 = uVar8 & 0xffffffffffffe7ff;
LAB_0093fdc3:
  iVar3 = blockParams->numPartitions;
  uVar15 = (ulong)(iVar3 - 1) << 0xb | uVar8;
  if ((long)iVar3 < 2) {
    if (iVar3 != 1) goto LAB_0093fe11;
    local_88.m_words[0] =
         (ulong)blockParams->colorEndpointModes[0] << 0xd | uVar8 & 0xfffffffffffe07ff;
  }
  else {
    uVar15 = uVar15 & 0xffffffffff801fff | (ulong)blockParams->partitionSeed << 0xd;
LAB_0093fe11:
    if (blockParams->isMultiPartSingleCemMode == false) {
      if (iVar3 == 3) {
        iVar12 = -4 - iVar6;
        iVar26 = 0x7b;
LAB_0093fe6c:
        iVar26 = iVar26 - iVar6;
      }
      else {
        if (iVar3 == 4) {
          iVar12 = -7 - iVar6;
          iVar26 = 0x78;
          goto LAB_0093fe6c;
        }
        iVar6 = (uint)(iVar3 == 2) + iVar6;
        iVar26 = 0x7f - iVar6;
        iVar12 = -iVar6;
      }
      pdVar2 = blockParams->colorEndpointModes;
      std::__min_element<unsigned_int_const*,__gnu_cxx::__ops::_Iter_less_iter>
                (pdVar2,blockParams->colorEndpointModes + iVar3);
      puVar9 = std::__max_element<unsigned_int_const*,__gnu_cxx::__ops::_Iter_less_iter>
                         (pdVar2,blockParams->colorEndpointModes + iVar3);
      local_48 = (ulong)((*puVar9 >> 2) + (uint)(*puVar9 >> 2 == 0));
      local_88.m_words[0] = local_48 << 0x17 | uVar15 & 0xfffffffffe7fffff;
      uVar8 = 0;
      iVar6 = 0;
      if (0 < iVar3) {
        iVar6 = iVar3;
      }
      local_50 = (ulong)((iVar26 + iVar3) - 3);
      local_40 = (ulong)(uint)(iVar6 * 2);
      iVar6 = 0x19;
      for (; local_40 != uVar8; uVar8 = uVar8 + 2) {
        uVar10 = *(uint *)((long)pdVar2 + uVar8 * 2);
        iVar4 = (int)uVar8;
        AssignBlock128::setBit(&local_88,iVar6,(uint)(uVar10 >> 2 == (uint)local_48));
        iVar18 = iVar26 + -4;
        if ((uint)(iVar3 + iVar4) < 4) {
          iVar18 = 0x19;
        }
        AssignBlock128::setBit(&local_88,iVar18 + iVar3 + iVar4,uVar10 & 1);
        iVar18 = iVar3 + 0x1a;
        if (3 < (uint)(iVar3 + 1 + iVar4)) {
          iVar18 = (int)local_50;
        }
        AssignBlock128::setBit(&local_88,iVar18 + iVar4,uVar10 >> 1 & 1);
        iVar6 = iVar6 + 1;
      }
      bVar13 = blockParams->isDualPlane;
      goto LAB_0093ffb1;
    }
    local_88.m_words[0] =
         (ulong)blockParams->colorEndpointModes[0] << 0x19 | uVar15 & 0xffffffffe07fffff;
  }
  iVar12 = 1 - iVar6;
LAB_0093ffb1:
  local_a0 = blockParams->colorEndpointModes;
  if ((bVar13 & 1) != 0) {
    AssignBlock128::setBits(&local_88,iVar12 + 0x7d,iVar12 + 0x7e,blockParams->ccs);
  }
  pIVar1 = local_60;
  local_78.m_length = computeNumRequiredBits(local_60,iVar16);
  pIVar5 = local_58;
  local_78.m_startNdxInSrc = 0x7f;
  local_78.m_forward = false;
  local_78.m_ndx = 0;
  local_78.m_dst = &local_88;
  encodeISE(&local_78,pIVar1,local_58,iVar16);
  iVar3 = blockParams->numPartitions;
  iVar6 = computeNumColorEndpointValues(local_a0,iVar3,blockParams->isMultiPartSingleCemMode);
  iVar16 = computeNumBitsForColorEndpoints(blockParams);
  iVar26 = 0x1d;
  if (iVar3 == 1) {
    iVar26 = 0x11;
  }
  local_38 = computeMaximumRangeISEParams(iVar16,iVar6);
  local_78.m_forward = true;
  local_78.m_ndx = 0;
  local_78.m_dst = &local_88;
  local_78.m_startNdxInSrc = iVar26;
  local_78.m_length = iVar16;
  encodeISE(&local_78,&local_38,pIVar5 + 1,iVar6);
  AVar27.m_words[0] = local_88.m_words[0];
  AVar27.m_words[1] = local_88.m_words[1];
  return (AssignBlock128)AVar27.m_words;
switchD_0093fa8b_caseD_6:
  uVar8 = 0x1fffffffe00;
  uVar11 = uVar10;
  goto LAB_0093faee;
}

Assistant:

static AssignBlock128 generateNormalBlock (const NormalBlockParams& blockParams, int blockWidth, int blockHeight, const NormalBlockISEInputs& iseInputs)
{
	DE_ASSERT(isValidBlockParams(blockParams, blockWidth, blockHeight));
	DE_UNREF(blockWidth);	// \note For non-debug builds.
	DE_UNREF(blockHeight);	// \note For non-debug builds.

	AssignBlock128	block;
	const int		numWeights		= computeNumWeights(blockParams);
	const int		numWeightBits	= computeNumRequiredBits(blockParams.weightISEParams, numWeights);

	writeBlockMode(block, blockParams);

	block.setBits(11, 12, blockParams.numPartitions - 1);
	if (blockParams.numPartitions > 1)
		block.setBits(13, 22, blockParams.partitionSeed);

	{
		const int extraCemBitsStart = 127 - numWeightBits - (blockParams.numPartitions == 1 || blockParams.isMultiPartSingleCemMode		? -1
															: blockParams.numPartitions == 4											? 7
															: blockParams.numPartitions == 3											? 4
															: blockParams.numPartitions == 2											? 1
															: 0);

		writeColorEndpointModes(block, &blockParams.colorEndpointModes[0], blockParams.isMultiPartSingleCemMode, blockParams.numPartitions, extraCemBitsStart);

		if (blockParams.isDualPlane)
			block.setBits(extraCemBitsStart-2, extraCemBitsStart-1, blockParams.ccs);
	}

	writeWeightData(block, blockParams.weightISEParams, iseInputs.weight, numWeights);

	{
		const int			numColorEndpointValues		= computeNumColorEndpointValues(&blockParams.colorEndpointModes[0], blockParams.numPartitions, blockParams.isMultiPartSingleCemMode);
		const int			numBitsForColorEndpoints	= computeNumBitsForColorEndpoints(blockParams);
		const int			colorEndpointDataStartNdx	= blockParams.numPartitions == 1 ? 17 : 29;
		const ISEParams&	colorEndpointISEParams		= computeMaximumRangeISEParams(numBitsForColorEndpoints, numColorEndpointValues);

		writeColorEndpointData(block, colorEndpointISEParams, iseInputs.endpoint, numColorEndpointValues, numBitsForColorEndpoints, colorEndpointDataStartNdx);
	}

	return block;
}